

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::FileOptions::_InternalSerialize
          (FileOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FeatureSet *value;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *value_00;
  uint8_t *puVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  int index;
  char *in_R9;
  undefined8 *puVar8;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view s_05;
  string_view s_06;
  string_view s_07;
  string_view s_08;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  string_view field_name_04;
  string_view field_name_05;
  string_view field_name_06;
  string_view field_name_07;
  string_view field_name_08;
  
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 1) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.java_package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.FileOptions.java_package";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x28,field_name);
    s._M_str = (char *)*puVar8;
    s._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if ((uVar2 & 2) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.java_outer_classname_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.FileOptions.java_outer_classname";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x30,field_name_00);
    s_00._M_str = (char *)*puVar8;
    s_00._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,8,s_00,target);
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (ulong)(this->field_0)._impl_.optimize_for_;
    pbVar5 = target + 1;
    *target = 0x48;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar1);
    }
    *pbVar5 = (byte)uVar6;
    target = pbVar5 + 1;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.java_multiple_files_;
    *target = 0x50;
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 4) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.go_package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)"google.protobuf.FileOptions.go_package";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x26,field_name_01);
    s_01._M_str = (char *)*puVar8;
    s_01._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0xb,s_01,target);
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.cc_generic_services_;
    target[0] = 0x80;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.java_generic_services_;
    target[0] = 0x88;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.py_generic_services_;
    target[0] = 0x90;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((short)uVar2 < 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.java_generate_equals_and_hash_;
    target[0] = 0xa0;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.deprecated_;
    target[0] = 0xb8;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.java_string_check_utf8_;
    target[0] = 0xd8;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 >> 0x13 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.cc_enable_arenas_;
    target[0] = 0xf8;
    target[1] = 1;
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 & 8) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.objc_class_prefix_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
             );
    field_name_02._M_str = in_R9;
    field_name_02._M_len = (size_t)"google.protobuf.FileOptions.objc_class_prefix";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x2d,field_name_02);
    s_02._M_str = (char *)*puVar8;
    s_02._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0x24,s_02,target);
  }
  if ((uVar2 & 0x10) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.csharp_namespace_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    field_name_03._M_str = in_R9;
    field_name_03._M_len = (size_t)"google.protobuf.FileOptions.csharp_namespace";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x2c,field_name_03);
    s_03._M_str = (char *)*puVar8;
    s_03._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0x25,s_03,target);
  }
  if ((uVar2 & 0x20) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.swift_prefix_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_04._M_str = in_R9;
    field_name_04._M_len = (size_t)"google.protobuf.FileOptions.swift_prefix";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x28,field_name_04);
    s_04._M_str = (char *)*puVar8;
    s_04._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0x27,s_04,target);
  }
  if ((uVar2 & 0x40) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.php_class_prefix_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    field_name_05._M_str = in_R9;
    field_name_05._M_len = (size_t)"google.protobuf.FileOptions.php_class_prefix";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x2c,field_name_05);
    s_05._M_str = (char *)*puVar8;
    s_05._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0x28,s_05,target);
  }
  if ((char)uVar2 < '\0') {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.php_namespace_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_06._M_str = in_R9;
    field_name_06._M_len = (size_t)"google.protobuf.FileOptions.php_namespace";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x29,field_name_06);
    s_06._M_str = (char *)*puVar8;
    s_06._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0x29,s_06,target);
  }
  if ((uVar2 >> 8 & 1) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.php_metadata_namespace_.tagged_ptr_.ptr_ &
             0xfffffffffffffffc);
    field_name_07._M_str = in_R9;
    field_name_07._M_len = (size_t)"google.protobuf.FileOptions.php_metadata_namespace";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x32,field_name_07);
    s_07._M_str = (char *)*puVar8;
    s_07._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0x2c,s_07,target);
  }
  if ((uVar2 >> 9 & 1) != 0) {
    puVar8 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.ruby_package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_08._M_str = in_R9;
    field_name_08._M_len = (size_t)"google.protobuf.FileOptions.ruby_package";
    protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar8,(char *)(ulong)*(uint *)(puVar8 + 1),1,0x28,field_name_08);
    s_08._M_str = (char *)*puVar8;
    s_08._M_len = puVar8[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0x2d,s_08,target);
  }
  if ((uVar2 >> 10 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    target = protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x32,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target
                        ,stream);
  }
  iVar3 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar3 != 0) {
    index = 0;
    do {
      value_00 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase
                            ,index);
      target = protobuf::internal::WireFormatLite::InternalWriteMessage
                         (999,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_
                          ,target,stream);
      index = index + 1;
    } while (iVar3 != index);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_FileOptions_default_instance_,target,stream);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar4 = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FileOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FileOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string java_package = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_java_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.java_package");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional string java_outer_classname = 8;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_java_outer_classname();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.java_outer_classname");
    target = stream->WriteStringMaybeAliased(8, _s, target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if ((cached_has_bits & 0x00040000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        9, this_._internal_optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        10, this_._internal_java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_go_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.go_package");
    target = stream->WriteStringMaybeAliased(11, _s, target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        16, this_._internal_cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if ((cached_has_bits & 0x00002000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        17, this_._internal_java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if ((cached_has_bits & 0x00004000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        18, this_._internal_py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
  if ((cached_has_bits & 0x00008000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        20, this_._internal_java_generate_equals_and_hash(), target);
  }

  // optional bool deprecated = 23 [default = false];
  if ((cached_has_bits & 0x00010000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        23, this_._internal_deprecated(), target);
  }

  // optional bool java_string_check_utf8 = 27 [default = false];
  if ((cached_has_bits & 0x00020000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        27, this_._internal_java_string_check_utf8(), target);
  }

  // optional bool cc_enable_arenas = 31 [default = true];
  if ((cached_has_bits & 0x00080000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        31, this_._internal_cc_enable_arenas(), target);
  }

  // optional string objc_class_prefix = 36;
  if ((cached_has_bits & 0x00000008u) != 0) {
    const ::std::string& _s = this_._internal_objc_class_prefix();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.objc_class_prefix");
    target = stream->WriteStringMaybeAliased(36, _s, target);
  }

  // optional string csharp_namespace = 37;
  if ((cached_has_bits & 0x00000010u) != 0) {
    const ::std::string& _s = this_._internal_csharp_namespace();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.csharp_namespace");
    target = stream->WriteStringMaybeAliased(37, _s, target);
  }

  // optional string swift_prefix = 39;
  if ((cached_has_bits & 0x00000020u) != 0) {
    const ::std::string& _s = this_._internal_swift_prefix();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.swift_prefix");
    target = stream->WriteStringMaybeAliased(39, _s, target);
  }

  // optional string php_class_prefix = 40;
  if ((cached_has_bits & 0x00000040u) != 0) {
    const ::std::string& _s = this_._internal_php_class_prefix();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.php_class_prefix");
    target = stream->WriteStringMaybeAliased(40, _s, target);
  }

  // optional string php_namespace = 41;
  if ((cached_has_bits & 0x00000080u) != 0) {
    const ::std::string& _s = this_._internal_php_namespace();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.php_namespace");
    target = stream->WriteStringMaybeAliased(41, _s, target);
  }

  // optional string php_metadata_namespace = 44;
  if ((cached_has_bits & 0x00000100u) != 0) {
    const ::std::string& _s = this_._internal_php_metadata_namespace();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.php_metadata_namespace");
    target = stream->WriteStringMaybeAliased(44, _s, target);
  }

  // optional string ruby_package = 45;
  if ((cached_has_bits & 0x00000200u) != 0) {
    const ::std::string& _s = this_._internal_ruby_package();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FileOptions.ruby_package");
    target = stream->WriteStringMaybeAliased(45, _s, target);
  }

  // optional .google.protobuf.FeatureSet features = 50;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        50, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileOptions)
  return target;
}